

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_thread.hpp
# Opt level: O2

void __thiscall
asio::detail::posix_thread::
posix_thread<asio::detail::resolver_service_base::work_io_context_runner>
          (posix_thread *this,work_io_context_runner f,uint param_2)

{
  func_base *arg;
  
  this->joined_ = false;
  arg = (func_base *)operator_new(0x10);
  arg->_vptr_func_base = (_func_int **)&PTR__func_base_00122b18;
  arg[1]._vptr_func_base = (_func_int **)f.io_context_;
  start_thread(this,arg);
  return;
}

Assistant:

posix_thread(Function f, unsigned int = 0)
    : joined_(false)
  {
    start_thread(new func<Function>(f));
  }